

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::ArraySpliceHelper<double>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *addr;
  uint uVar1;
  Type *pTVar2;
  Recycler *recycler;
  Type TVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined4 *puVar7;
  SparseArraySegment<double> *pSVar8;
  SparseArraySegmentBase *pSVar9;
  SparseArraySegmentBase *pSVar10;
  Type TVar11;
  Type *pTVar12;
  uint uVar13;
  uint uVar14;
  uint32 uVar15;
  Type TVar16;
  ulong uVar17;
  Type *local_80;
  Type *local_68;
  SparseArraySegmentBase *local_58;
  Type *local_48;
  
  recycler = scriptContext->recycler;
  addr = &pArr->head;
  TVar11.ptr = (pArr->head).ptr;
  if (TVar11.ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar5) goto LAB_00b94394;
    *puVar7 = 0;
    TVar11.ptr = addr->ptr;
  }
  if (TVar11.ptr == EmptySegment) {
    AllocateHead<double>(pArr);
    TVar11.ptr = (pArr->head).ptr;
  }
  uVar14 = (TVar11.ptr)->left + (TVar11.ptr)->size;
  if (CARRY4((TVar11.ptr)->left,(TVar11.ptr)->size)) {
    uVar14 = 0xffffffff;
  }
  local_48 = (Type *)addr;
  if (start < uVar14) {
    local_58 = (SparseArraySegmentBase *)0x0;
    local_80 = (Type *)addr;
  }
  else {
    do {
      local_58 = TVar11.ptr;
      local_80 = local_48;
      local_48 = (Type *)&local_58->next;
      TVar11.ptr = (local_58->next).ptr;
      if (TVar11.ptr == (SparseArraySegmentBase *)0x0) {
        IsInlineSegment((SparseArraySegmentBase *)0x0,pArr);
        goto LAB_00b93c76;
      }
      uVar14 = (TVar11.ptr)->left + (TVar11.ptr)->size;
      if (CARRY4((TVar11.ptr)->left,(TVar11.ptr)->size)) {
        uVar14 = 0xffffffff;
      }
    } while (uVar14 <= start);
  }
  uVar13 = deleteLen + start;
  bVar5 = IsInlineSegment(TVar11.ptr,pArr);
  uVar14 = (TVar11.ptr)->left;
  if ((uVar14 <= start) && (uVar13 <= (TVar11.ptr)->length + uVar14)) {
    pSVar9 = ((TVar11.ptr)->next).ptr;
    ArraySegmentSpliceHelper<double>
              (pnewArr,(SparseArraySegment<double> *)TVar11.ptr,local_48,start,deleteLen,insertArgs,
               insertLen,recycler);
    if (pSVar9 != (SparseArraySegmentBase *)0x0) {
      do {
        pSVar9->left = pSVar9->left + (insertLen - deleteLen);
        pSVar10 = (pSVar9->next).ptr;
        if (pSVar10 == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(pSVar9);
          pSVar10 = (pSVar9->next).ptr;
        }
        pSVar9 = pSVar10;
      } while (pSVar10 != (SparseArraySegmentBase *)0x0);
    }
    if (*(SparseArraySegmentBase **)local_48 == (SparseArraySegmentBase *)0x0) {
      return;
    }
    SparseArraySegmentBase::EnsureSizeInBound(*(SparseArraySegmentBase **)local_48);
    return;
  }
  local_68 = &pnewArr->head;
  if (uVar14 < start) {
    uVar14 = uVar14 + (TVar11.ptr)->length;
    uVar15 = uVar14 - start;
    if (start <= uVar14 && uVar15 != 0) {
      if ((((TVar11.ptr)->next).ptr != (SparseArraySegmentBase *)0x0) ||
         (bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase), bVar5)) {
        pSVar8 = SparseArraySegment<double>::AllocateSegmentImpl<false>
                           (recycler,0,uVar15,uVar15,(SparseArraySegmentBase *)0x0);
      }
      else {
        pSVar8 = SparseArraySegment<double>::AllocateSegmentImpl<true>
                           (recycler,0,uVar15,uVar15,(SparseArraySegmentBase *)0x0);
      }
      pSVar9 = &SparseArraySegment<double>::CopySegment(recycler,pSVar8,0,TVar11.ptr,start,uVar15)->
                super_SparseArraySegmentBase;
      (pSVar9->next).ptr = (SparseArraySegmentBase *)0x0;
      Memory::Recycler::WBSetBit((char *)local_68);
      local_68->ptr = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
      SparseArraySegment<double>::Truncate((SparseArraySegment<double> *)TVar11.ptr,start);
      local_68 = &pSVar9->next;
    }
    pTVar12 = (Type *)&(TVar11.ptr)->next;
    local_80 = local_48;
    local_58 = TVar11.ptr;
  }
  else {
    if (!bVar5) goto LAB_00b93bff;
    if (start < uVar14) goto LAB_00b93bff;
    uVar1 = (TVar11.ptr)->length + uVar14;
    uVar15 = uVar1 - start;
    pTVar12 = local_48;
    if (uVar1 < start || uVar15 == 0) {
      if (uVar14 != 0 || (TVar11.ptr)->length != 0) goto LAB_00b93bff;
      if ((TVar11.ptr)->size == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
        if (!bVar5) goto LAB_00b94394;
        *puVar7 = 0;
      }
      pSVar9 = ((TVar11.ptr)->next).ptr;
      Memory::Recycler::WBSetBit((char *)local_48);
      *(SparseArraySegmentBase **)local_48 = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
    }
    else {
      if (((TVar11.ptr)->next).ptr == (SparseArraySegmentBase *)0x0) {
        pSVar8 = SparseArraySegment<double>::AllocateSegment
                           (recycler,0,uVar15,uVar15,(SparseArraySegmentBase *)0x0);
      }
      else {
        pSVar8 = SparseArraySegment<double>::AllocateSegmentImpl<false>
                           (recycler,0,uVar15,uVar15,(SparseArraySegmentBase *)0x0);
      }
      pSVar9 = &SparseArraySegment<double>::CopySegment(recycler,pSVar8,0,TVar11.ptr,start,uVar15)->
                super_SparseArraySegmentBase;
      Memory::Recycler::WBSetBit((char *)local_68);
      local_68->ptr = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
      local_68 = &pSVar9->next;
      pSVar9 = ((TVar11.ptr)->next).ptr;
      Memory::Recycler::WBSetBit((char *)local_48);
      *(SparseArraySegmentBase **)local_48 = pSVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,TVar11.ptr,0);
    }
  }
  TVar11.ptr = ((TVar11.ptr)->next).ptr;
  local_48 = pTVar12;
  while (TVar11.ptr != (SparseArraySegmentBase *)0x0) {
LAB_00b93bff:
    TVar16 = (TVar11.ptr)->left;
    if (uVar13 < (TVar11.ptr)->length + TVar16) {
      bVar5 = false;
      if (local_58 != (SparseArraySegmentBase *)0x0) goto LAB_00b93de4;
      pTVar12 = local_48;
      if (TVar16 != 0) goto LAB_00b93cca;
      TVar16 = 0;
      local_58 = (SparseArraySegmentBase *)0x0;
      goto LAB_00b93de4;
    }
    pTVar2 = &(TVar11.ptr)->next;
    TVar3.ptr = ((TVar11.ptr)->next).ptr;
    (TVar11.ptr)->left = TVar16 - start;
    ((TVar11.ptr)->next).ptr = (SparseArraySegmentBase *)0x0;
    Memory::Recycler::WBSetBit((char *)local_68);
    local_68->ptr = TVar11.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
    Memory::Recycler::WBSetBit((char *)local_48);
    *(SparseArraySegmentBase **)local_48 = TVar3.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
    TVar11.ptr = TVar3.ptr;
    local_68 = pTVar2;
  }
  if (local_58 == (SparseArraySegmentBase *)0x0) {
    bVar5 = true;
    TVar11.ptr = (SparseArraySegmentBase *)0x0;
    pTVar12 = local_48;
LAB_00b93cca:
    local_80 = pTVar12;
    if (addr->ptr != TVar11.ptr) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
      if (!bVar6) goto LAB_00b94394;
      *puVar7 = 0;
    }
    EnsureHeadStartsFromZero<double>(pArr,recycler);
    local_58 = (pArr->head).ptr;
    if ((local_58 == (SparseArraySegmentBase *)0x0) || ((local_58->next).ptr != TVar11.ptr)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                  "pArr->head && pArr->head->next == startSeg");
      if (!bVar6) goto LAB_00b94394;
      *puVar7 = 0;
      local_58 = addr->ptr;
    }
    local_48 = (Type *)&local_58->next;
    if (bVar5) {
      if (TVar11.ptr != (SparseArraySegmentBase *)0x0) goto LAB_00b93fb8;
    }
    else {
      TVar16 = (TVar11.ptr)->left;
      bVar5 = true;
LAB_00b93de4:
      uVar14 = uVar13 - TVar16;
      if (TVar16 <= uVar13 && uVar14 != 0) {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
        if (bVar6) {
          pSVar8 = SparseArraySegment<double>::AllocateSegmentImpl<false>
                             (recycler,TVar16 - start,uVar14,(SparseArraySegmentBase *)0x0);
        }
        else {
          pSVar8 = SparseArraySegment<double>::AllocateSegmentImpl<true>
                             (recycler,TVar16 - start,uVar14,(SparseArraySegmentBase *)0x0);
        }
        pSVar9 = &SparseArraySegment<double>::CopySegment
                            (recycler,pSVar8,(TVar11.ptr)->left - start,TVar11.ptr,
                             (TVar11.ptr)->left,uVar14)->super_SparseArraySegmentBase;
        (pSVar9->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)local_68);
        local_68->ptr = pSVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
        uVar17 = (ulong)((TVar11.ptr)->length - uVar14);
        memmove_xplat(TVar11.ptr + 1,&TVar11.ptr[1].left + (ulong)uVar14 * 2,uVar17 * 8);
        if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015bf41c) == 1) {
          (*g_verifyIsNotBarrierAddress)(TVar11.ptr + 1,uVar17);
        }
        (TVar11.ptr)->left = (TVar11.ptr)->left + uVar14;
        (TVar11.ptr)->length = (TVar11.ptr)->length - uVar14;
        SparseArraySegmentBase::CheckLengthvsSize(TVar11.ptr);
        SparseArraySegment<double>::Truncate
                  ((SparseArraySegment<double> *)TVar11.ptr,
                   (TVar11.ptr)->length + (TVar11.ptr)->left);
        SparseArraySegmentBase::EnsureSizeInBound(TVar11.ptr);
        TVar16 = (TVar11.ptr)->left;
      }
      if (bVar5 && (TVar16 - deleteLen) + insertLen == 0) {
        if (TVar16 - deleteLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar5) goto LAB_00b94394;
          *puVar7 = 0;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = TVar11.ptr;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        local_58 = (SparseArraySegmentBase *)0x0;
        local_48 = (Type *)addr;
      }
LAB_00b93fb8:
      do {
        (TVar11.ptr)->left = (TVar11.ptr)->left + (insertLen - deleteLen);
        pSVar9 = ((TVar11.ptr)->next).ptr;
        if (pSVar9 == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(TVar11.ptr);
          pSVar9 = ((TVar11.ptr)->next).ptr;
        }
        TVar11.ptr = pSVar9;
      } while (pSVar9 != (SparseArraySegmentBase *)0x0);
    }
    SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
    if (local_58 != (SparseArraySegmentBase *)0x0) goto LAB_00b94002;
    bVar5 = true;
    local_58 = (SparseArraySegmentBase *)0x0;
  }
  else {
LAB_00b93c76:
    SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
LAB_00b94002:
    SparseArraySegmentBase::EnsureSizeInBound(local_58);
    bVar5 = false;
  }
  if (insertLen == 0) {
    return;
  }
  bVar6 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
  if ((bVar6) || (bVar6 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr), bVar6)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar6) goto LAB_00b94394;
    *puVar7 = 0;
  }
  if (!bVar5) {
    uVar14 = local_58->left;
    if (start < uVar14) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar5) {
LAB_00b94394:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
      uVar14 = local_58->left;
    }
    uVar13 = local_58->size - (start - uVar14);
    if (start - uVar14 <= local_58->size && uVar13 != 0) {
      uVar15 = insertLen - uVar13;
      TVar11.ptr = local_58;
      if (uVar13 <= insertLen && uVar15 != 0) {
        bVar5 = IsInlineSegment(local_58,pArr);
        pSVar9 = (local_58->next).ptr;
        if (pSVar9 == (SparseArraySegmentBase *)0x0) {
          TVar11.ptr = &SparseArraySegment<double>::GrowByMin(local_58,recycler,uVar15)->
                        super_SparseArraySegmentBase;
        }
        else {
          TVar11.ptr = &SparseArraySegment<double>::GrowByMinMax
                                  (local_58,recycler,uVar15,
                                   pSVar9->left - (local_58->left + local_58->size))->
                        super_SparseArraySegmentBase;
        }
        if (bVar5) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,local_58,0);
        }
      }
      Memory::Recycler::WBSetBit((char *)local_80);
      *(SparseArraySegmentBase **)local_80 = TVar11.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_80);
      (TVar11.ptr)->length = (start + insertLen) - (TVar11.ptr)->left;
      SparseArraySegmentBase::CheckLengthvsSize(TVar11.ptr);
      goto LAB_00b94263;
    }
  }
  TVar11.ptr = *(SparseArraySegmentBase **)local_48;
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
  if ((TVar11.ptr != (SparseArraySegmentBase *)0x0) || (bVar5)) {
    TVar11.ptr = &SparseArraySegment<double>::AllocateSegmentImpl<false>
                            (recycler,start,insertLen,TVar11.ptr)->super_SparseArraySegmentBase;
  }
  else {
    TVar11.ptr = &SparseArraySegment<double>::AllocateSegmentImpl<true>
                            (recycler,start,insertLen,(SparseArraySegmentBase *)0x0)->
                  super_SparseArraySegmentBase;
  }
  TVar3.ptr = *(SparseArraySegmentBase **)local_48;
  Memory::Recycler::WBSetBit((char *)&(TVar11.ptr)->next);
  ((TVar11.ptr)->next).ptr = TVar3.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&(TVar11.ptr)->next);
  Memory::Recycler::WBSetBit((char *)local_48);
  *(SparseArraySegmentBase **)local_48 = TVar11.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
LAB_00b94263:
  Memory::CopyArray<double,double,Memory::Recycler>
            ((double *)(&TVar11.ptr[1].left + (ulong)(start - (TVar11.ptr)->left) * 2),
             (ulong)insertLen,(double *)insertArgs,(ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }